

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

void deqp::gls::FboUtil::config::glInitLayered
               (TextureLayered *cfg,GLint depth_divider,Functions *gl)

{
  glTexImage3DFunc p_Var1;
  GLenum GVar2;
  int iVar3;
  TransferFormat TVar4;
  int iVar5;
  GLsizei GVar6;
  int iVar7;
  
  TVar4 = transferImageFormat(&(cfg->super_Texture).super_Image.internalFormat);
  if (0 < (cfg->super_Texture).numLevels) {
    iVar3 = *(int *)&(cfg->super_Texture).field_0x1c;
    GVar6 = (cfg->super_Texture).super_Image.width;
    iVar5 = (cfg->super_Texture).super_Image.height;
    iVar7 = 0;
    do {
      p_Var1 = gl->texImage3D;
      GVar2 = glTarget((Image *)cfg);
      (*p_Var1)(GVar2,iVar7,(cfg->super_Texture).super_Image.internalFormat.format,GVar6,iVar5,iVar3
                ,0,TVar4.format,TVar4.dataType,(void *)0x0);
      GVar6 = GVar6 / 2;
      if (GVar6 < 2) {
        GVar6 = 1;
      }
      iVar5 = iVar5 / 2;
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      iVar3 = iVar3 / depth_divider;
      if (iVar3 < 2) {
        iVar3 = 1;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < (cfg->super_Texture).numLevels);
  }
  return;
}

Assistant:

static void glInitLayered (const TextureLayered& cfg,
						   GLint depth_divider, const glw::Functions& gl)
{
	const TransferFormat format = transferImageFormat(cfg.internalFormat);
	GLint w = cfg.width;
	GLint h = cfg.height;
	GLint depth = cfg.numLayers;
	for (GLint level = 0; level < cfg.numLevels; level++)
	{
		gl.texImage3D(glTarget(cfg), level, cfg.internalFormat.format, w, h, depth, 0,
					  format.format, format.dataType, DE_NULL);
		w = de::max(1, w / 2);
		h = de::max(1, h / 2);
		depth = de::max(1, depth / depth_divider);
	}
}